

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O3

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::string_t,duckdb::string_t,double,double,duckdb::TernaryLambdaWrapper,double(*)(duckdb::string_t_const&,duckdb::string_t_const&,double_const&)>
               (string_t *adata,string_t *bdata,double *cdata,double *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_double_string_t_ptr_string_t_ptr_double_ptr *fun)

{
  string_t *psVar1;
  unsigned_long *puVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar3;
  double dVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t idx_in_entry;
  anon_union_16_2_67f50693_for_value local_88;
  double local_70;
  string_t *local_68;
  string_t *local_60;
  double *local_58;
  double *local_50;
  anon_union_16_2_67f50693_for_value local_48;
  buffer_ptr<ValidityBuffer> *local_38;
  
  local_68 = adata;
  local_60 = bdata;
  local_58 = cdata;
  local_50 = result_data;
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    if (count != 0) {
      uVar12 = 0;
      do {
        uVar7 = uVar12;
        if (asel->sel_vector != (sel_t *)0x0) {
          uVar7 = (ulong)asel->sel_vector[uVar12];
        }
        uVar10 = uVar12;
        if (bsel->sel_vector != (sel_t *)0x0) {
          uVar10 = (ulong)bsel->sel_vector[uVar12];
        }
        uVar11 = uVar12;
        if (csel->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)csel->sel_vector[uVar12];
        }
        local_88._0_8_ = *(undefined8 *)&local_68[uVar7].value;
        local_88.pointer.ptr = local_68[uVar7].value.pointer.ptr;
        psVar1 = local_60 + uVar10;
        local_48._0_8_ = *(undefined8 *)&psVar1->value;
        local_48._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
        local_48._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
        local_70 = local_58[uVar11];
        dVar4 = (*fun)((string_t *)&local_88.pointer,(string_t *)&local_48.pointer,&local_70);
        local_50[uVar12] = dVar4;
        uVar12 = uVar12 + 1;
      } while (count != uVar12);
    }
  }
  else if (count != 0) {
    local_38 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    uVar12 = 0;
    do {
      uVar7 = uVar12;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar7 = (ulong)asel->sel_vector[uVar12];
      }
      uVar10 = uVar12;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)bsel->sel_vector[uVar12];
      }
      uVar11 = uVar12;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)csel->sel_vector[uVar12];
      }
      puVar2 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0))
          && ((puVar2 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
              puVar2 == (unsigned_long *)0x0 || ((puVar2[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
             )) && ((puVar2 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
                    puVar2 == (unsigned_long *)0x0 ||
                    ((puVar2[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0)))) {
        local_88._0_8_ = *(undefined8 *)&local_68[uVar7].value;
        local_88.pointer.ptr = local_68[uVar7].value.pointer.ptr;
        psVar1 = local_60 + uVar10;
        local_48._0_8_ = *(undefined8 *)&psVar1->value;
        local_48._8_4_ = *(undefined4 *)((long)&psVar1->value + 8);
        local_48._12_4_ = *(undefined4 *)((long)&psVar1->value + 0xc);
        local_70 = local_58[uVar11];
        dVar4 = (*fun)((string_t *)&local_88.pointer,(string_t *)&local_48.pointer,&local_70);
        local_50[uVar12] = dVar4;
      }
      else {
        _Var9._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_48._0_8_ = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88.pointer,(unsigned_long *)&local_48);
          uVar6 = local_88.pointer.ptr;
          uVar5 = local_88._0_8_;
          local_88._0_8_ = (element_type *)0x0;
          local_88.pointer.ptr = (char *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar5;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.pointer.ptr !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88.pointer.ptr);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_38);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var9._M_head_impl;
        }
        bVar3 = (byte)uVar12 & 0x3f;
        _Var9._M_head_impl[uVar12 >> 6] =
             _Var9._M_head_impl[uVar12 >> 6] & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar12 = uVar12 + 1;
    } while (count != uVar12);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}